

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iend,
                 size_t *offsetPtr,U32 mls,U32 extDict)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  U32 UVar5;
  uint uVar6;
  int iVar7;
  U32 UVar8;
  size_t sVar9;
  BYTE *mEnd;
  BYTE *pBVar10;
  BYTE *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ulong *in_R8;
  int in_stack_00000008;
  U32 mIndex;
  BYTE *match;
  size_t matchLength;
  U32 *nextPtr;
  size_t bestLength;
  U32 dummy32;
  U32 matchEndIdx;
  U32 *largerPtr;
  U32 *smallerPtr;
  BYTE *prefixStart;
  BYTE *dictEnd;
  U32 dictLimit;
  BYTE *dictBase;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 nextCandidateIdx;
  U32 *nextCandidateIdxPtr;
  U32 previousCandidate;
  U32 nbCandidates;
  U32 nbCompares;
  U32 *unsortedMark;
  U32 *nextCandidate;
  U32 unsortLimit;
  U32 btLow;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  U32 windowLow;
  U32 current;
  BYTE *base;
  U32 matchIndex;
  size_t h;
  U32 hashLog;
  U32 *hashTable;
  U32 in_stack_fffffffffffffed0;
  U32 in_stack_fffffffffffffed4;
  void *in_stack_fffffffffffffed8;
  uint local_11c;
  uint uVar11;
  undefined4 in_stack_fffffffffffffeec;
  uint *puVar12;
  BYTE *ip_00;
  uint local_f0;
  int local_ec;
  uint *local_e8;
  uint *local_e0;
  long local_d8;
  long local_d0;
  uint local_c4;
  long local_c0;
  BYTE *local_b8;
  BYTE *local_b0;
  uint local_a4;
  uint *local_a0;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint *local_88;
  uint uVar13;
  ZSTD_compressionParameters *cParams_00;
  uint uVar14;
  int in_stack_ffffffffffffffb0;
  uint local_4c;
  
  lVar1 = *(long *)(in_RDI + 0x30);
  sVar9 = ZSTD_hashPtr(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0
                      );
  local_4c = *(uint *)(lVar1 + sVar9 * 4);
  lVar2 = *(long *)(in_RDI + 8);
  uVar4 = (int)in_RDX - (int)lVar2;
  uVar14 = *(uint *)(in_RDI + 0x1c);
  cParams_00 = *(ZSTD_compressionParameters **)(in_RDI + 0x40);
  UVar5 = *(int *)(in_RSI + 4) - 1;
  uVar6 = (1 << ((byte)UVar5 & 0x1f)) - 1;
  if (uVar6 < uVar4) {
    uVar11 = uVar4 - uVar6;
  }
  else {
    uVar11 = 0;
  }
  local_11c = uVar14;
  if (uVar14 < uVar11) {
    local_11c = uVar11;
  }
  local_8c = 1 << ((byte)*(undefined4 *)(in_RSI + 0xc) & 0x1f);
  local_94 = 0;
  local_90 = local_8c;
  while( true ) {
    puVar12 = &cParams_00->windowLog + ((local_4c & uVar6) << 1);
    local_88 = &cParams_00->chainLog + ((local_4c & uVar6) << 1);
    bVar3 = false;
    if ((local_11c < local_4c) && (bVar3 = false, *local_88 == 1)) {
      bVar3 = 1 < local_90;
    }
    if (!bVar3) break;
    *local_88 = local_94;
    local_94 = local_4c;
    local_4c = *puVar12;
    local_90 = local_90 - 1;
  }
  if ((local_11c < local_4c) && (*local_88 == 1)) {
    *local_88 = 0;
    *puVar12 = 0;
  }
  local_4c = local_94;
  uVar13 = uVar11;
  while (local_4c != 0) {
    local_a0 = &cParams_00->chainLog + ((local_4c & uVar6) << 1);
    local_a4 = *local_a0;
    ZSTD_insertDUBT1((ZSTD_matchState_t *)CONCAT44(uVar4,uVar14),cParams_00,UVar5,
                     (BYTE *)CONCAT44(uVar13,local_11c),(U32)((ulong)puVar12 >> 0x20),(U32)puVar12,
                     in_stack_ffffffffffffffb0);
    local_90 = local_90 + 1;
    local_4c = local_a4;
  }
  local_b0 = (BYTE *)0x0;
  local_b8 = (BYTE *)0x0;
  local_c0 = *(long *)(in_RDI + 0x10);
  local_c4 = *(uint *)(in_RDI + 0x18);
  local_d0 = local_c0 + (ulong)local_c4;
  local_d8 = lVar2 + (ulong)local_c4;
  local_e0 = &cParams_00->windowLog + ((uVar4 & uVar6) << 1);
  local_ec = uVar4 + 9;
  ip_00 = (BYTE *)0x0;
  local_4c = *(uint *)(lVar1 + sVar9 * 4);
  *(uint *)(lVar1 + sVar9 * 4) = uVar4;
  local_e8 = &cParams_00->chainLog + ((uVar4 & uVar6) << 1);
LAB_0021c963:
  do {
    if (local_8c == 0 || local_4c <= uVar14) {
LAB_0021cc7f:
      *local_e8 = 0;
      *local_e0 = 0;
      *(int *)(in_RDI + 0x24) = local_ec + -8;
      return (size_t)ip_00;
    }
    puVar12 = &cParams_00->windowLog + ((local_4c & uVar6) << 1);
    pBVar10 = local_b8;
    if (local_b0 < local_b8) {
      pBVar10 = local_b0;
    }
    if ((in_stack_00000008 == 0) || ((BYTE *)(ulong)local_c4 <= pBVar10 + local_4c)) {
      mEnd = (BYTE *)(lVar2 + (ulong)local_4c);
      local_8c = local_8c - 1;
      sVar9 = ZSTD_count(ip_00,(BYTE *)puVar12,pBVar10);
      pBVar10 = pBVar10 + sVar9;
    }
    else {
      mEnd = (BYTE *)(local_c0 + (ulong)local_4c);
      local_8c = local_8c - 1;
      sVar9 = ZSTD_count_2segments
                        (ip_00,(BYTE *)puVar12,pBVar10,mEnd,
                         (BYTE *)CONCAT44(in_stack_fffffffffffffeec,uVar11));
      pBVar10 = pBVar10 + sVar9;
      if ((BYTE *)(ulong)local_c4 <= pBVar10 + local_4c) {
        mEnd = (BYTE *)(lVar2 + (ulong)local_4c);
      }
    }
    if (ip_00 < pBVar10) {
      if ((BYTE *)(ulong)(local_ec - local_4c) < pBVar10) {
        local_ec = local_4c + (int)pBVar10;
      }
      iVar7 = ((int)pBVar10 - (int)ip_00) * 4;
      UVar5 = ZSTD_highbit32((uVar4 - local_4c) + 1);
      UVar8 = ZSTD_highbit32((int)*in_R8 + 1);
      if ((int)(UVar5 - UVar8) < iVar7) {
        *in_R8 = (ulong)((uVar4 + 2) - local_4c);
        ip_00 = pBVar10;
      }
      if (pBVar10 + in_RDX == in_RCX) goto LAB_0021cc7f;
    }
    if (pBVar10[in_RDX] <= mEnd[(long)pBVar10]) {
      *local_e8 = local_4c;
      if (local_4c <= uVar13) {
        local_e8 = &local_f0;
        goto LAB_0021cc7f;
      }
      local_4c = *puVar12;
      local_e8 = puVar12;
      local_b8 = pBVar10;
      goto LAB_0021c963;
    }
    *local_e0 = local_4c;
    if (local_4c <= uVar13) {
      local_e0 = &local_f0;
      goto LAB_0021cc7f;
    }
    local_e0 = puVar12 + 1;
    local_4c = puVar12[1];
    local_b0 = pBVar10;
  } while( true );
}

Assistant:

static size_t ZSTD_DUBT_findBestMatch (
                            ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                            const BYTE* const ip, const BYTE* const iend,
                            size_t* offsetPtr,
                            U32 const mls,
                            U32 const extDict)
{
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const current = (U32)(ip-base);
    U32    const windowLow = ms->window.lowLimit;

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= current) ? 0 : current - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", current);
    assert(ip <= iend-8);   /* required for h calculation */

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;   /* nullify next candidate if it's still unsorted (note : simplification, detrimental to compression ratio, beneficial for speed) */
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, cParams, matchIndex, iend,
                         nbCandidates, unsortLimit, extDict);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller=0, commonLengthLarger=0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(current&btMask);
        U32* largerPtr  = bt + 2*(current&btMask) + 1;
        U32 matchEndIdx = current+8+1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = current;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((!extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(current-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + current - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        assert(matchEndIdx > current+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = current - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        current, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}